

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O2

agent_queue_ref_t __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::make_new_agent_queue
          (dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
           *this,bind_params_t *params)

{
  agent_queue_t *this_00;
  params_t *in_RDX;
  
  this_00 = (agent_queue_t *)operator_new(0x70);
  impl::agent_queue_t::agent_queue_t(this_00,(dispatcher_queue_t *)(params + 1),in_RDX);
  (this->super_ext_dispatcher_iface_t<so_5::disp::thread_pool::bind_params_t>).super_dispatcher_t.
  _vptr_dispatcher_t = (_func_int **)this_00;
  LOCK();
  (this_00->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
       (this_00->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i +
       1;
  UNLOCK();
  return (agent_queue_ref_t)(agent_queue_t *)this;
}

Assistant:

agent_queue_ref_t
		make_new_agent_queue(
			const PARAMS & params )
			{
				return agent_queue_ref_t(
						new AGENT_QUEUE{ m_queue, params } );
			}